

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::InternalSerializeWithCachedSizesToArray
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *this,bool deterministic,uint8 *output)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8 *puVar3;
  undefined4 extraout_var_00;
  undefined7 in_register_00000031;
  
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])
                    (this,CONCAT71(in_register_00000031,deterministic));
  *output = '\n';
  puVar3 = io::CodedOutputStream::WriteStringWithSizeToArray
                     ((string *)CONCAT44(extraout_var,iVar2),output + 1);
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
  uVar1 = *(undefined8 *)CONCAT44(extraout_var_00,iVar2);
  *puVar3 = '\x11';
  *(undefined8 *)(puVar3 + 1) = uVar1;
  return puVar3 + 9;
}

Assistant:

::google::protobuf::uint8* InternalSerializeWithCachedSizesToArray(bool deterministic,
                                                   ::google::protobuf::uint8* output) const {
    output = KeyTypeHandler::InternalWriteToArray(kKeyFieldNumber, key(),
                                                  deterministic, output);
    output = ValueTypeHandler::InternalWriteToArray(kValueFieldNumber, value(),
                                                    deterministic, output);
    return output;
  }